

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_set.cpp
# Opt level: O2

void __thiscall
duckdb::TableFunctionSet::TableFunctionSet(TableFunctionSet *this,TableFunction *fun)

{
  string sStack_38;
  
  ::std::__cxx11::string::string
            ((string *)&sStack_38,
             (string *)
             &(fun->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name);
  FunctionSet<duckdb::TableFunction>::FunctionSet
            (&this->super_FunctionSet<duckdb::TableFunction>,&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&(this->super_FunctionSet<duckdb::TableFunction>).functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,fun);
  return;
}

Assistant:

TableFunctionSet::TableFunctionSet(TableFunction fun) : FunctionSet(std::move(fun.name)) {
	functions.push_back(std::move(fun));
}